

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

int iscleared(global_State *g,GCObject *o)

{
  GCObject *o_local;
  global_State *g_local;
  
  if (o == (GCObject *)0x0) {
    g_local._4_4_ = 0;
  }
  else if ((o->tt & 0xf) == 4) {
    if ((o->marked & 0x18) != 0) {
      if (9 < (o->tt & 0xf)) {
        __assert_fail("(((o)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0xb9,"int iscleared(global_State *, const GCObject *)");
      }
      reallymarkobject(g,o);
    }
    g_local._4_4_ = 0;
  }
  else {
    g_local._4_4_ = o->marked & 0x18;
  }
  return g_local._4_4_;
}

Assistant:

static int iscleared (global_State *g, const GCObject *o) {
  if (o == NULL) return 0;  /* non-collectable value */
  else if (novariant(o->tt) == LUA_TSTRING) {
    markobject(g, o);  /* strings are 'values', so are never weak */
    return 0;
  }
  else return iswhite(o);
}